

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::HierarchicalReferenceExpression&,std::nullopt_t_const&>
          (BumpAllocator *this,HierarchicalReferenceExpression *args,nullopt_t *args_1)

{
  optional<slang::ast::SequenceRepetition> repetition;
  nullopt_t *expr;
  SimpleAssertionExpr *this_00;
  _Storage<slang::ast::SequenceRepetition,_true> local_38;
  undefined4 local_28;
  nullopt_t *local_20;
  nullopt_t *args_local_1;
  HierarchicalReferenceExpression *args_local;
  BumpAllocator *this_local;
  
  local_20 = args_1;
  args_local_1 = (nullopt_t *)args;
  args_local = (HierarchicalReferenceExpression *)this;
  this_00 = (SimpleAssertionExpr *)allocate(this,0x30,8);
  expr = args_local_1;
  std::optional<slang::ast::SequenceRepetition>::optional
            ((optional<slang::ast::SequenceRepetition> *)&local_38);
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._M_value.range.max.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       local_38._M_value.range.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._0_8_ = local_38._0_8_;
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._16_4_ = local_28;
  ast::SimpleAssertionExpr::SimpleAssertionExpr(this_00,(Expression *)expr,repetition);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }